

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

bool __thiscall
CommandLineArguments::addGroupDotNameFilter(CommandLineArguments *this,int ac,char **av,int *i)

{
  size_t sVar1;
  TestFilter *pTVar2;
  SimpleStringCollection *this_00;
  TestFilter *this_01;
  CommandLineArguments *in_RCX;
  undefined8 in_RDX;
  int ac_00;
  undefined4 in_ESI;
  int *in_RDI;
  SimpleStringCollection collection;
  SimpleString groupDotName;
  char *in_stack_fffffffffffffee8;
  SimpleStringCollection *in_stack_fffffffffffffef0;
  SimpleString *in_stack_fffffffffffffef8;
  TestFilter *in_stack_ffffffffffffff00;
  SimpleStringCollection *in_stack_ffffffffffffff10;
  SimpleStringCollection *in_stack_ffffffffffffff18;
  SimpleString *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SimpleString *in_stack_ffffffffffffff78;
  SimpleString *in_stack_ffffffffffffff80;
  SimpleStringCollection local_78 [3];
  byte local_1;
  
  ac_00 = (int)((ulong)in_RDX >> 0x20);
  SimpleString::SimpleString((SimpleString *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  getParameterField(in_RCX,ac_00,(char **)CONCAT44(in_ESI,in_stack_ffffffffffffff38),in_RDI,
                    in_stack_ffffffffffffff28);
  SimpleString::~SimpleString((SimpleString *)0x126cc5);
  SimpleStringCollection::SimpleStringCollection(in_stack_fffffffffffffef0);
  SimpleString::SimpleString((SimpleString *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  SimpleString::split(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                      (SimpleStringCollection *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  SimpleString::~SimpleString((SimpleString *)0x126d16);
  sVar1 = SimpleStringCollection::size(local_78);
  local_1 = sVar1 == 2;
  if ((bool)local_1) {
    pTVar2 = (TestFilter *)
             operator_new((size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0);
    this_00 = (SimpleStringCollection *)
              SimpleStringCollection::operator[]
                        (in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff10 =
         (SimpleStringCollection *)
         SimpleStringCollection::operator[](this_00,(size_t)in_stack_ffffffffffffff10);
    sVar1 = SimpleString::size((SimpleString *)0x126e2b);
    SimpleString::subString((SimpleString *)this_00,(size_t)in_stack_ffffffffffffff10,sVar1);
    TestFilter::TestFilter(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    pTVar2 = TestFilter::add(pTVar2,*(TestFilter **)(in_RDI + 0xe));
    *(TestFilter **)(in_RDI + 0xe) = pTVar2;
    SimpleString::~SimpleString((SimpleString *)0x126e97);
    this_01 = (TestFilter *)
              operator_new((size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0);
    SimpleStringCollection::operator[](this_00,(size_t)in_stack_ffffffffffffff10);
    TestFilter::TestFilter(pTVar2,&this_01->filter_);
    pTVar2 = TestFilter::add(this_01,*(TestFilter **)(in_RDI + 0x10));
    *(TestFilter **)(in_RDI + 0x10) = pTVar2;
  }
  SimpleStringCollection::~SimpleStringCollection(in_stack_ffffffffffffff10);
  SimpleString::~SimpleString((SimpleString *)0x126fb7);
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineArguments::addGroupDotNameFilter(int ac, const char *const *av, int& i)
{
    SimpleString groupDotName = getParameterField(ac, av, i, "-t");
    SimpleStringCollection collection;
    groupDotName.split(".", collection);

    if (collection.size() != 2) return false;

    groupFilters_ = (new TestFilter(collection[0].subString(0, collection[0].size()-1)))->add(groupFilters_);
    nameFilters_ = (new TestFilter(collection[1]))->add(nameFilters_);
    return true;
}